

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O3

EGLint deqp::egl::ChooseConfigRandomCase::getApiBits(Random *rnd)

{
  deBool dVar1;
  deBool dVar2;
  deBool dVar3;
  deBool dVar4;
  
  dVar1 = deRandom_getBool(&rnd->m_rnd);
  dVar2 = deRandom_getBool(&rnd->m_rnd);
  dVar3 = deRandom_getBool(&rnd->m_rnd);
  dVar4 = deRandom_getBool(&rnd->m_rnd);
  return (uint)(dVar2 == 1) + (uint)(dVar1 == 1) * 8 + (uint)(dVar3 == 1) * 4 +
         (uint)(dVar4 == 1) * 2;
}

Assistant:

static EGLint getApiBits (de::Random& rnd)
	{
		EGLint api = 0;
		api |= rnd.getBool() ? EGL_OPENGL_BIT		: 0;
		api |= rnd.getBool() ? EGL_OPENGL_ES_BIT	: 0;
		api |= rnd.getBool() ? EGL_OPENGL_ES2_BIT	: 0;
		api |= rnd.getBool() ? EGL_OPENVG_BIT		: 0;
		return api;
	}